

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

float GetDraggedColumnOffset(ImGuiOldColumns *columns,int column_index)

{
  float fVar1;
  float fVar2;
  ImGuiContext *pIVar3;
  long in_RDI;
  float fVar4;
  float fVar5;
  float x;
  ImGuiWindow *window;
  ImGuiContext *g;
  float local_24;
  int column_index_00;
  ImGuiWindow *pIVar6;
  
  pIVar3 = GImGui;
  pIVar6 = GImGui->CurrentWindow;
  fVar5 = (GImGui->IO).MousePos.x;
  fVar1 = (GImGui->ActiveIdClickOffset).x;
  fVar2 = (pIVar6->Pos).x;
  fVar4 = ImGui::GetColumnOffset((int)pIVar6);
  column_index_00 = (int)pIVar6;
  local_24 = ImMax<float>(((fVar5 - fVar1) + 4.0) - fVar2,fVar4 + (pIVar3->Style).ColumnsMinSpacing)
  ;
  if ((*(uint *)(in_RDI + 4) & 4) != 0) {
    fVar5 = ImGui::GetColumnOffset(column_index_00);
    local_24 = ImMin<float>(local_24,fVar5 - (pIVar3->Style).ColumnsMinSpacing);
  }
  return local_24;
}

Assistant:

static float GetDraggedColumnOffset(ImGuiOldColumns* columns, int column_index)
{
    // Active (dragged) column always follow mouse. The reason we need this is that dragging a column to the right edge of an auto-resizing
    // window creates a feedback loop because we store normalized positions. So while dragging we enforce absolute positioning.
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(column_index > 0); // We are not supposed to drag column 0.
    IM_ASSERT(g.ActiveId == columns->ID + ImGuiID(column_index));

    float x = g.IO.MousePos.x - g.ActiveIdClickOffset.x + COLUMNS_HIT_RECT_HALF_WIDTH - window->Pos.x;
    x = ImMax(x, ImGui::GetColumnOffset(column_index - 1) + g.Style.ColumnsMinSpacing);
    if ((columns->Flags & ImGuiOldColumnFlags_NoPreserveWidths))
        x = ImMin(x, ImGui::GetColumnOffset(column_index + 1) - g.Style.ColumnsMinSpacing);

    return x;
}